

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_e175ba::processLinkDirectories
          (anon_unknown_dwarf_e175ba *this,cmGeneratorTarget *tgt,
          vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
          *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *directories,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *uniqueDirectories,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
          bool debugDirectories,string *language)

{
  cmTarget *pcVar1;
  cmLocalGenerator *this_00;
  bool bVar2;
  PolicyStatus PVar3;
  string *psVar4;
  string *arg;
  ostream *poVar5;
  long *plVar6;
  cmake *this_01;
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var7;
  long *plVar8;
  size_type *psVar9;
  PolicyID id;
  MessageType t;
  pointer in_name;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar10;
  string usedDirectories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryDirectories;
  __hashtable *__h;
  ostringstream e;
  string local_298;
  undefined1 *local_278;
  long local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  long *local_218 [2];
  long local_208 [2];
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *local_1f8;
  cmTarget *local_1f0;
  cmGeneratorExpressionDAGChecker *local_1e8;
  cmGeneratorTarget *local_1e0;
  anon_unknown_dwarf_e175ba *local_1d8;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_1d0;
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_1c8;
  string *local_1c0;
  cmListFileBacktrace local_1b8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if (tgt != (cmGeneratorTarget *)entries) {
    local_1d8 = this + 0x540;
    local_1f8 = entries;
    local_1e8 = dagChecker;
    local_1d0 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                directories;
    local_1c8 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 *)uniqueDirectories;
    do {
      pcVar1 = tgt->Target;
      local_1e0 = tgt;
      psVar4 = cmLinkItem::AsStr_abi_cxx11_
                         (*(cmLinkItem **)
                           &(pcVar1->Properties).
                            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                            ._M_t._M_impl);
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1f0 = pcVar1;
      arg = (string *)
            (**(code **)(*(long *)pcVar1 + 0x18))
                      (pcVar1,*(undefined8 *)(this + 0x10),config,0,this,local_1e8,language);
      cmSystemTools::ExpandListArgument(arg,&local_238,false);
      local_278 = &local_268;
      local_270 = 0;
      local_268 = 0;
      local_1c0 = local_238.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      in_name = local_238.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_238.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            if (psVar4->_M_string_length == 0) {
              PVar3 = cmPolicies::PolicyMap::Get((PolicyMap *)local_1d8,CMP0081);
              t = FATAL_ERROR;
              if (PVar3 == OLD) {
                bVar2 = true;
              }
              else {
                if (PVar3 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_298,(cmPolicies *)0x51,id);
                  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_1a8,local_298._M_dataplus._M_p,
                                      local_298._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_298._M_dataplus._M_p != &local_298.field_2) {
                    operator_delete(local_298._M_dataplus._M_p,
                                    local_298.field_2._M_allocated_capacity + 1);
                  }
                  t = AUTHOR_WARNING;
                }
                bVar2 = false;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Found relative path while evaluating link directories of \"",0x3a);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,*(char **)(*(long *)this + 0xc0),
                                  *(long *)(*(long *)this + 200));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":\n  \"",6);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(in_name->_M_dataplus)._M_p,in_name->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
              if (!bVar2) goto LAB_002c3f10;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8)
              ;
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,
                                  psVar4->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"\" contains relative path in its INTERFACE_LINK_DIRECTORIES:\n  \""
                         ,0x3f);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(in_name->_M_dataplus)._M_p,in_name->_M_string_length);
              t = FATAL_ERROR;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
LAB_002c3f10:
              this_00 = *(cmLocalGenerator **)(this + 0x10);
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(this_00,t,&local_298);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._M_dataplus._M_p != &local_298.field_2) {
                operator_delete(local_298._M_dataplus._M_p,
                                local_298.field_2._M_allocated_capacity + 1);
              }
              if (t == FATAL_ERROR) {
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
                if (local_278 != &local_268) {
                  operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_238);
                return;
              }
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(in_name);
          local_1a8._0_8_ = local_1c8;
          pVar10 = std::
                   _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                             (local_1c8,in_name,local_1a8);
          if ((((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
             (std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string&>(local_1d0,in_name), debugDirectories)) {
            std::operator+(&local_298," * ",in_name);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
            local_1a8._0_8_ = local_1a8 + 0x10;
            p_Var7 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)(plVar6 + 2);
            if ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 *)*plVar6 == p_Var7) {
              local_198[0]._0_8_ = *(undefined8 *)p_Var7;
              local_198[0]._8_8_ = plVar6[3];
            }
            else {
              local_198[0]._0_8_ = *(undefined8 *)p_Var7;
              local_1a8._0_8_ =
                   (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)*plVar6;
            }
            local_1a8._8_8_ = plVar6[1];
            *plVar6 = (long)p_Var7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_278,local_1a8._0_8_);
            if ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 *)local_1a8._0_8_ !=
                (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 *)(local_1a8 + 0x10)) {
              operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
          }
          in_name = in_name + 1;
        } while (in_name != local_1c0);
        if (local_270 != 0) {
          this_01 = cmLocalGenerator::GetCMakeInstance(*(cmLocalGenerator **)(this + 0x10));
          local_218[0] = local_208;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_218,"Used link directories for target ","");
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_218,*(ulong *)(*(long *)this + 0xc0));
          local_258 = &local_248;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_248 = *plVar8;
            lStack_240 = plVar6[3];
          }
          else {
            local_248 = *plVar8;
            local_258 = (long *)*plVar6;
          }
          local_250 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          psVar9 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_298.field_2._M_allocated_capacity = *psVar9;
            local_298.field_2._8_8_ = plVar6[3];
          }
          else {
            local_298.field_2._M_allocated_capacity = *psVar9;
            local_298._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_298._M_string_length = plVar6[1];
          *plVar6 = (long)psVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_278);
          p_Var7 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)(plVar6 + 2);
          if ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)*plVar6 == p_Var7) {
            local_198[0]._0_8_ = *(undefined8 *)p_Var7;
            local_198[0]._8_8_ = plVar6[3];
            local_1a8._0_8_ =
                 (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)(local_1a8 + 0x10);
          }
          else {
            local_198[0]._0_8_ = *(undefined8 *)p_Var7;
            local_1a8._0_8_ =
                 (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)*plVar6;
          }
          local_1a8._8_8_ = plVar6[1];
          *plVar6 = (long)p_Var7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          (**(code **)(*(long *)local_1f0 + 0x20))(&local_1b8);
          cmake::IssueMessage(this_01,LOG,(string *)local_1a8,&local_1b8);
          if (local_1b8.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1b8.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)local_1a8._0_8_ !=
              (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if (local_258 != &local_248) {
            operator_delete(local_258,local_248 + 1);
          }
          if (local_218[0] != local_208) {
            operator_delete(local_218[0],local_208[0] + 1);
          }
        }
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_238);
      tgt = (cmGeneratorTarget *)&local_1e0->Makefile;
    } while (tgt != (cmGeneratorTarget *)local_1f8);
  }
  return;
}

Assistant:

void processLinkDirectories(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& directories,
  std::unordered_set<std::string>& uniqueDirectories,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugDirectories, std::string const& language)
{
  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();

    std::vector<std::string> entryDirectories;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt,
                                                      dagChecker, language),
                                      entryDirectories);

    std::string usedDirectories;
    for (std::string& entryDirectory : entryDirectories) {
      if (!cmSystemTools::FileIsFullPath(entryDirectory)) {
        std::ostringstream e;
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (!targetName.empty()) {
          /* clang-format off */
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_LINK_DIRECTORIES:\n"
            "  \"" << entryDirectory << "\"";
          /* clang-format on */
        } else {
          switch (tgt->GetPolicyStatusCMP0081()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0081) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
              break;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }
          e << "Found relative path while evaluating link directories of "
               "\""
            << tgt->GetName() << "\":\n  \"" << entryDirectory << "\"\n";
        }
        if (!noMessage) {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == MessageType::FATAL_ERROR) {
            return;
          }
        }
      }

      // Sanitize the path the same way the link_directories command does
      // in case projects set the LINK_DIRECTORIES property directly.
      cmSystemTools::ConvertToUnixSlashes(entryDirectory);
      if (uniqueDirectories.insert(entryDirectory).second) {
        directories.emplace_back(entryDirectory);
        if (debugDirectories) {
          usedDirectories += " * " + entryDirectory + "\n";
        }
      }
    }
    if (!usedDirectories.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used link directories for target ") + tgt->GetName() +
          ":\n" + usedDirectories,
        entry->GetBacktrace());
    }
  }
}